

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Maybe<kj::Array<unsigned_long>_> *
kj::parse::
Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'['>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::ExactlyConst_<char,_'x'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,_']'>_>,_false>
::Impl<kj::parse::IteratorInput<char,_const_char_*>,_unsigned_long>::apply
          (Maybe<kj::Array<unsigned_long>_> *__return_storage_ptr__,
          Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>
          *subParser,IteratorInput<char,_const_char_*> *input)

{
  ArrayDisposer *pAVar1;
  Maybe<kj::Array<unsigned_long>_> *pMVar2;
  undefined1 uVar3;
  IteratorInput<char,_const_char_*> subInput;
  NullableValue<unsigned_long> _subResult425;
  Results results;
  IteratorInput<char,_const_char_*> local_a8;
  Maybe<kj::Array<unsigned_long>_> *local_80;
  Sequence_<kj::parse::ExactlyConst_<char,__[_>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,__]_>_>
  local_78;
  Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::ExactlyConst_<char,__x_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,__0_>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>
  *local_60;
  ArrayBuilder<unsigned_long> local_58;
  
  local_58.ptr = (unsigned_long *)0x0;
  local_58.pos = (RemoveConst<unsigned_long> *)0x0;
  local_58.endPtr = (unsigned_long *)0x0;
  local_58.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_80 = __return_storage_ptr__;
  do {
    pAVar1 = (ArrayDisposer *)input->pos;
    if (pAVar1 == (ArrayDisposer *)input->end) break;
    local_a8.parent = input;
    local_a8.pos = (char *)pAVar1;
    local_a8.end = input->end;
    local_a8.best = (char *)pAVar1;
    Sequence_<kj::parse::ExactlyConst_<char,_'['>,_const_kj::parse::Sequence_<kj::parse::OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::ExactlyConst_<char,_'x'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_true>_>,_kj::parse::_::ParseInteger<16U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_'0'>,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<8U>_>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::CharGroup_,_kj::parse::Many_<const_kj::parse::CharGroup__&,_false>_>,_kj::parse::_::ParseInteger<10U>_>_>,_kj::parse::NotLookingAt_<kj::parse::CharGroup_>_>_&,_kj::parse::ExactlyConst_<char,_']'>_>
    ::parseNext<kj::parse::IteratorInput<char,_const_char_*>_>
              (&local_78,(IteratorInput<char,_const_char_*> *)subParser);
    uVar3 = local_78._0_1_;
    local_78.rest.rest._0_1_ = local_78._0_1_;
    if (local_78._0_1_ == '\x01') {
      local_60 = local_78.rest.first;
      (local_a8.parent)->pos = local_a8.pos;
      Vector<unsigned_long>::add<unsigned_long>
                ((Vector<unsigned_long> *)&local_58,(unsigned_long *)&local_60);
    }
    IteratorInput<char,_const_char_*>::~IteratorInput(&local_a8);
  } while (uVar3 != '\0');
  Vector<unsigned_long>::releaseAsArray
            ((Array<unsigned_long> *)&local_a8,(Vector<unsigned_long> *)&local_58);
  pMVar2 = local_80;
  (local_80->ptr).isSet = true;
  (local_80->ptr).field_1.value.ptr = (unsigned_long *)local_a8.parent;
  (local_80->ptr).field_1.value.size_ = (size_t)local_a8.pos;
  (local_80->ptr).field_1.value.disposer = (ArrayDisposer *)local_a8.end;
  local_a8.parent = (IteratorInput<char,_const_char_*> *)0x0;
  local_a8.pos = (char *)0x0;
  Array<unsigned_long>::~Array((Array<unsigned_long> *)&local_a8);
  ArrayBuilder<unsigned_long>::dispose(&local_58);
  return pMVar2;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_SOME(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(subResult));
      } else {
        break;
      }
    }